

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

LValue * __thiscall
slang::ast::SimpleAssignmentPatternExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,SimpleAssignmentPatternExpression *this,
          EvalContext *context)

{
  pointer ppEVar1;
  size_t sVar2;
  __index_type _Var3;
  bool bVar4;
  long lVar5;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> lvals;
  LValue lval;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> local_1d8;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b8;
  
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            (&local_1d8,
             (this->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value);
  ppEVar1 = (this->super_AssignmentPatternExpressionBase).elements_._M_ptr;
  sVar2 = (this->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
  lVar5 = 0;
  do {
    if (sVar2 << 3 == lVar5) {
      bVar4 = Type::isIntegral((this->super_AssignmentPatternExpressionBase).super_Expression.type.
                               ptr);
      LValue::LValue(__return_storage_ptr__,&local_1d8,(uint)!bVar4);
      break;
    }
    Expression::evalLValue
              ((LValue *)&local_1b8,*(Expression **)(*(long *)((long)ppEVar1 + lVar5) + 0x40),
               context);
    _Var3 = local_1b8._M_index;
    if (local_1b8._M_index == '\0') {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
       + 0x180) = '\0';
    }
    else {
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
      emplace_back<slang::ast::LValue>(&local_1d8,(LValue *)&local_1b8);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
    ~_Variant_storage(&local_1b8);
    lVar5 = lVar5 + 8;
  } while (_Var3 != '\0');
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

LValue SimpleAssignmentPatternExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(elements().size());
    for (auto elem : elements()) {
        LValue lval = elem->as<AssignmentExpression>().left().evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    auto lvalKind = type->isIntegral() ? LValue::Concat::Packed : LValue::Concat::Unpacked;
    return LValue(std::move(lvals), lvalKind);
}